

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O2

void Of_ManComputeCuts(Of_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  int *piVar4;
  int iVar5;
  int i;
  uint *puVar6;
  ulong uVar7;
  
  iVar5 = 0;
  while ((iVar5 < p->pGia->nObjs && (pGVar3 = Gia_ManObj(p->pGia,iVar5), pGVar3 != (Gia_Obj_t *)0x0)
         )) {
    uVar2 = (uint)*(undefined8 *)pGVar3;
    if ((~uVar2 & 0x1fffffff) != 0 && -1 < (int)uVar2) {
      iVar1 = Gia_ObjIsBuf(pGVar3);
      if (iVar1 == 0) {
        Of_ObjMergeOrder(p,iVar5);
      }
      else {
        i = iVar5 - (uVar2 & 0x1fffffff);
        iVar1 = Vec_IntEntry(&p->vCutFlows,i);
        Vec_IntWriteEntry(&p->vCutFlows,iVar5,iVar1);
        iVar1 = Vec_IntEntry(&p->vCutDelays,i);
        Vec_IntWriteEntry(&p->vCutDelays,iVar5,iVar1);
      }
    }
    iVar5 = iVar5 + 1;
  }
  iVar5 = 0;
  while ((iVar5 < p->pGia->nObjs && (pGVar3 = Gia_ManObj(p->pGia,iVar5), pGVar3 != (Gia_Obj_t *)0x0)
         )) {
    if (((~*(uint *)pGVar3 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar3) &&
       (iVar1 = Gia_ObjIsBuf(pGVar3), iVar1 == 0)) {
      piVar4 = Of_ObjCutSet(p,iVar5);
      iVar1 = Of_ObjHasCuts(p,iVar5);
      if (iVar1 == 0) {
        __assert_fail("Of_ObjHasCuts(p, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                      ,0x19e,"void Of_ManLiftCuts(Of_Man_t *, int)");
      }
      puVar6 = (uint *)(piVar4 + 1);
      for (iVar1 = 0; uVar7 = 1, iVar1 < *piVar4; iVar1 = iVar1 + 1) {
        for (; uVar7 <= (*puVar6 & 0x1f); uVar7 = uVar7 + 1) {
          uVar2 = Abc_Var2Lit(puVar6[uVar7],0);
          puVar6[uVar7] = uVar2;
        }
        puVar6 = puVar6 + (ulong)(*puVar6 & 0x1f) + 4;
      }
    }
    iVar5 = iVar5 + 1;
  }
  return;
}

Assistant:

void Of_ManComputeCuts( Of_Man_t * p )
{
    Gia_Obj_t * pObj; int i, iFanin;
    Gia_ManForEachAnd( p->pGia, pObj, i )
        if ( Gia_ObjIsBuf(pObj) )
        {
            iFanin = Gia_ObjFaninId0(pObj, i);
            Of_ObjSetCutFlow( p, i,  Of_ObjCutFlow(p, iFanin) );
            Of_ObjSetCutDelay( p, i, Of_ObjCutDelay(p, iFanin) );
        }
        else
            Of_ObjMergeOrder( p, i );
    Gia_ManForEachAnd( p->pGia, pObj, i )
        if ( !Gia_ObjIsBuf(pObj) )
            Of_ManLiftCuts( p, i );
}